

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O3

void __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
UnPop<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar4;
  
  uVar3 = (this->super_ContinuousPageStack<1UL>).nextTop + 0x20;
  if ((this->super_ContinuousPageStack<1UL>).bufferSize < uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x107,"(nextTop + size <= bufferSize)","nextTop + size <= bufferSize");
    if (!bVar2) goto LAB_00ef38a7;
    *puVar4 = 0;
    uVar3 = (this->super_ContinuousPageStack<1UL>).nextTop + 0x20;
  }
  (this->super_ContinuousPageStack<1UL>).nextTop = uVar3;
  if (uVar3 < 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0xf0,"(size <= nextTop)","size <= nextTop");
    if (!bVar2) goto LAB_00ef38a7;
    *puVar4 = 0;
  }
  if ((this->super_ContinuousPageStack<1UL>).bufferSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar2) goto LAB_00ef38a7;
    *puVar4 = 0;
  }
  if (*(size_t *)
       ((long)&(this->super_ContinuousPageStack<1UL>).pageAllocation[-1].pageCount +
       (this->super_ContinuousPageStack<1UL>).nextTop) != this->topElementSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x207,
                       "(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize)"
                       ,
                       "reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize"
                      );
    if (!bVar2) {
LAB_00ef38a7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->topElementSize = 0x20;
  return;
}

Assistant:

inline void ContinuousPageStackOfVariableElements<T, InitialPageCount>::UnPop()
{
    TemplateParameter::SameOrDerivedFrom<ActualT, T>(); // ActualT must be the same type as, or a type derived from, T
    ContinuousPageStack<InitialPageCount>::UnPop(VariableElement::template
    Size<ActualT>());
    Assert(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template
    Size<ActualT>()))->PreviousElementSize() == topElementSize);
    topElementSize = VariableElement::template Size<ActualT>();
}